

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<float> * __thiscall
cimg_library::CImg<float>::assign
          (CImg<float> *this,float *values,uint size_x,uint size_y,uint size_z,uint size_c)

{
  float *pfVar1;
  long lVar2;
  CImg<float> *pCVar3;
  float *__dest;
  ulong uVar4;
  
  uVar4 = (ulong)size_x * (ulong)size_c * (ulong)size_z * (ulong)size_y;
  if (values == (float *)0x0 || uVar4 == 0) {
    pCVar3 = assign(this);
    return pCVar3;
  }
  lVar2 = (ulong)this->_spectrum * (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
  pfVar1 = this->_data;
  if ((pfVar1 == values) && (uVar4 - lVar2 == 0)) {
    pCVar3 = assign(this,size_x,size_y,size_z,size_c);
    return pCVar3;
  }
  if ((this->_is_shared == false) && ((pfVar1 <= values + uVar4 && (values < pfVar1 + lVar2)))) {
    __dest = (float *)operator_new__(-(ulong)(uVar4 >> 0x3e != 0) | uVar4 * 4);
    memcpy(__dest,values,uVar4 * 4);
    if (pfVar1 != (float *)0x0) {
      operator_delete__(pfVar1);
    }
    this->_data = __dest;
    this->_width = size_x;
    this->_height = size_y;
    this->_depth = size_z;
    this->_spectrum = size_c;
  }
  else {
    assign(this,size_x,size_y,size_z,size_c);
    if (this->_is_shared == true) {
      memmove(this->_data,values,uVar4 * 4);
    }
    else {
      memcpy(this->_data,values,uVar4 * 4);
    }
  }
  return this;
}

Assistant:

CImg<T>& assign(const T *const values, const unsigned int size_x, const unsigned int size_y=1,
                    const unsigned int size_z=1, const unsigned int size_c=1) {
      const size_t siz = (size_t)size_x*size_y*size_z*size_c;
      if (!values || !siz) return assign();
      const size_t curr_siz = (size_t)size();
      if (values==_data && siz==curr_siz) return assign(size_x,size_y,size_z,size_c);
      if (_is_shared || values + siz<_data || values>=_data + size()) {
        assign(size_x,size_y,size_z,size_c);
        if (_is_shared) std::memmove((void*)_data,(void*)values,siz*sizeof(T));
        else std::memcpy((void*)_data,(void*)values,siz*sizeof(T));
      } else {
        T *new_data = 0;
        try { new_data = new T[siz]; } catch (...) {
          _width = _height = _depth = _spectrum = 0; _data = 0;
          throw CImgInstanceException(_cimg_instance
                                      "assign(): Failed to allocate memory (%s) for image (%u,%u,%u,%u).",
                                      cimg_instance,
                                      cimg::strbuffersize(sizeof(T)*size_x*size_y*size_z*size_c),
                                      size_x,size_y,size_z,size_c);
        }
        std::memcpy((void*)new_data,(void*)values,siz*sizeof(T));
        delete[] _data; _data = new_data; _width = size_x; _height = size_y; _depth = size_z; _spectrum = size_c;
      }
      return *this;
    }